

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O3

void GetBDOSCaps(int64_t sectors,BDOS_CAPS *bdc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (sectors != 0) {
    iVar3 = 0x64001c2;
    if ((int)sectors < 0x64001c2) {
      iVar3 = (int)sectors;
    }
    iVar2 = iVar3 >> 0x1f;
    iVar1 = iVar3 / 0xc800 + iVar2;
    bdc->list_sectors = (iVar1 - iVar2) + 1;
    iVar4 = (iVar1 - iVar2) + 2;
    bdc->base_sectors = iVar4;
    iVar4 = (iVar3 - iVar4) / 0x640;
    bdc->records = iVar4;
    iVar3 = (iVar3 - (iVar1 - iVar2)) + iVar4 * -0x640 + -2;
    bdc->extra_sectors = iVar3;
    bdc->need_byteswap = false;
    bdc->bootable = false;
    bdc->lba = false;
    if (0x31 < iVar3) {
      bdc->records = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void GetBDOSCaps(int64_t sectors, BDOS_CAPS& bdc)
{
    if (sectors)
    {
        // Maximum BDOS sector count, to give 65535 records (53GB)
        auto bdos_sectors = std::min(static_cast<int>(sectors), 104858050);

        bdc.list_sectors = bdos_sectors / ((BDOS_SECTOR_SIZE / BDOS_LABEL_SIZE) * BDOS_RECORD_SECTORS) + 1;
        bdc.base_sectors = 1 + bdc.list_sectors;    // +1 for boot sector
        bdc.records = (bdos_sectors - bdc.base_sectors) / BDOS_RECORD_SECTORS;
        bdc.extra_sectors = bdos_sectors - (bdc.base_sectors + bdc.records * BDOS_RECORD_SECTORS);
        bdc.need_byteswap = false;
        bdc.bootable = false;
        bdc.lba = false;

        // If the final block has enough for directory plus 1 track, add it as a partial record
        if ((bdc.extra_sectors / MGT_SECTORS) >= (MGT_DIR_TRACKS + 1))
            ++bdc.records;
    }
}